

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O2

void __thiscall cs::instance_type::check_declar_var(instance_type *this,iterator it,bool regist)

{
  token_base *ptVar1;
  _func_int **pp_Var2;
  int iVar3;
  token_base **pptVar4;
  internal_error *this_00;
  runtime_error *this_01;
  size_t sVar5;
  _func_int **pp_Var6;
  tree_type<cs::token_base_*> *t;
  _func_int **pp_Var7;
  allocator local_59;
  iterator it_local;
  string local_50;
  
  it_local = it;
  pptVar4 = tree_type<cs::token_base_*>::iterator::data(&it_local);
  if (*pptVar4 == (token_base *)0x0) {
    this_00 = (internal_error *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_50,"Null pointer accessed.",&local_59);
    internal_error::internal_error(this_00,&local_50);
    __cxa_throw(this_00,&internal_error::typeinfo,internal_error::~internal_error);
  }
  pptVar4 = tree_type<cs::token_base_*>::iterator::data(&it_local);
  iVar3 = (*(*pptVar4)->_vptr_token_base[2])();
  pptVar4 = tree_type<cs::token_base_*>::iterator::data(&it_local);
  ptVar1 = *pptVar4;
  if (iVar3 != 0xf) {
    if ((ptVar1 != (token_base *)0x0) &&
       (iVar3 = (*ptVar1->_vptr_token_base[2])(ptVar1), iVar3 == 4)) {
      if (!regist) {
        return;
      }
      domain_manager::add_record(&(this->super_runtime_type).storage,(string *)(ptVar1 + 3));
      return;
    }
    this_01 = (runtime_error *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string
              ((string *)&local_50,"Wrong grammar for variable declaration.",&local_59);
    runtime_error::runtime_error(this_01,&local_50);
    __cxa_throw(this_01,&runtime_error::typeinfo,runtime_error::~runtime_error);
  }
  pp_Var7 = ptVar1[2]._vptr_token_base;
  pp_Var6 = ptVar1[3]._vptr_token_base;
  sVar5 = ptVar1[3].line_num;
  pp_Var2 = ptVar1[4]._vptr_token_base;
  while (pp_Var7 != pp_Var2) {
    check_declar_var(this,(tree_node *)*pp_Var7,regist);
    pp_Var7 = pp_Var7 + 1;
    if (pp_Var7 == pp_Var6) {
      pp_Var7 = *(_func_int ***)(sVar5 + 8);
      sVar5 = sVar5 + 8;
      pp_Var6 = pp_Var7 + 0x40;
    }
  }
  return;
}

Assistant:

void instance_type::check_declar_var(tree_type<token_base *>::iterator it, bool regist)
	{
		if (it.data() == nullptr)
			throw internal_error("Null pointer accessed.");
		if (it.data()->get_type() == token_types::parallel) {
			auto &parallel_list = static_cast<token_parallel *>(it.data())->get_parallel();
			for (auto &t: parallel_list)
				check_declar_var(t.root(), regist);
		}
		else {
			token_base *root = it.data();
			if (root == nullptr || root->get_type() != token_types::id)
				throw runtime_error("Wrong grammar for variable declaration.");
			if (regist)
				storage.add_record(static_cast<token_id *>(root)->get_id());
		}
	}